

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O0

void test_2d_static<0ul,0ul,1ul,1ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  size_type sVar4;
  bool bVar5;
  int local_124 [2];
  dimensions<0UL,_0UL> local_119;
  int local_118;
  dimensions<0UL,_0UL> local_111;
  int *local_110;
  int *local_108;
  size_type local_100;
  dimensions<0UL,_0UL> local_f1;
  unsigned_long local_f0;
  size_t true_idx_2;
  dimensions<0UL,_0UL> local_dd;
  int i_2;
  int local_d8;
  int j_2;
  int local_d0;
  dimensions<0UL,_0UL> local_c9;
  int *local_c8;
  int *local_c0;
  size_type local_b8;
  dimensions<0UL,_0UL> local_a9;
  unsigned_long local_a8;
  size_t true_idx_1;
  int local_98;
  dimensions<0UL,_0UL> local_91;
  int i_1;
  int local_8c;
  int j_1;
  int *local_80;
  size_type local_78;
  dimensions<0UL,_0UL> local_69;
  unsigned_long local_68;
  size_t true_idx;
  int local_58;
  int i;
  int j;
  int dptr [1];
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_18,&local_1c)
  ;
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_28,&local_2c)
  ;
  local_38 = std::experimental::dimensions<1UL,_1UL>::size((dimensions<1UL,_1UL> *)local_b);
  local_40 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_38,&local_40)
  ;
  local_48 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::span(local_b);
  _j = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_48,
             (unsigned_long *)&j);
  for (local_58 = 0; uVar1 = (ulong)local_58,
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,1), uVar1 < vVar2; local_58 = local_58 + 1)
  {
    for (true_idx._4_4_ = 0; uVar1 = (ulong)true_idx._4_4_,
        vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                          ((dimensions<1UL,_1UL> *)local_b,0), uVar1 < vVar2;
        true_idx._4_4_ = true_idx._4_4_ + 1) {
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_69,1);
      local_68 = (vVar2 + vVar3) * (long)true_idx._4_4_ + (long)local_58;
      local_78 = std::experimental::
                 layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                 ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                   *)local_b,true_idx._4_4_,local_58);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_78,
                 &local_68);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,true_idx._4_4_,local_58);
      local_80 = &i + sVar4;
      _j_1 = &i + local_68;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_80,
                 (int **)&j_1);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,true_idx._4_4_,local_58);
      (&i)[sVar4] = 0x2a;
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,true_idx._4_4_,local_58);
      local_8c = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&i + sVar4,
                 &local_8c);
    }
  }
  i_1 = 0;
  while( true ) {
    uVar1 = (ulong)i_1;
    vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                      ((dimensions<1UL,_1UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_91,1);
    if (vVar2 + vVar3 <= uVar1) break;
    local_98 = 0;
    while( true ) {
      uVar1 = (ulong)local_98;
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>
                        ((dimensions<0UL,_0UL> *)((long)&true_idx_1 + 7),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_a9,1);
      local_a8 = (vVar2 + vVar3) * (long)local_98 + (long)i_1;
      local_b8 = std::experimental::
                 layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                 ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                   *)local_b,local_98,i_1);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_b8,
                 &local_a8);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,local_98,i_1);
      local_c0 = &i + sVar4;
      local_c8 = &i + local_a8;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_c0,
                 &local_c8);
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,0);
      bVar5 = false;
      if (vVar2 <= (ulong)(long)local_98) {
        uVar1 = (ulong)local_98;
        vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                          ((dimensions<1UL,_1UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_c9,0);
        bVar5 = uVar1 < vVar2 + vVar3;
      }
      if (bVar5) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_b,local_98,i_1);
        (&i)[sVar4] = 0x11;
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_b,local_98,i_1);
        local_d0 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x45,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&i + sVar4,
                   &local_d0);
      }
      else {
        vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                          ((dimensions<1UL,_1UL> *)local_b,1);
        bVar5 = false;
        if (vVar2 <= (ulong)(long)i_1) {
          uVar1 = (ulong)i_1;
          vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                            ((dimensions<1UL,_1UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>
                            ((dimensions<0UL,_0UL> *)((long)&j_2 + 3),1);
          bVar5 = uVar1 < vVar2 + vVar3;
        }
        if (bVar5) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,local_98,i_1);
          (&i)[sVar4] = 0x18;
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,local_98,i_1);
          local_d8 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x4d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&i + sVar4,
                     &local_d8);
        }
      }
      local_98 = local_98 + 1;
    }
    i_1 = i_1 + 1;
  }
  i_2 = 0;
  while( true ) {
    uVar1 = (ulong)i_2;
    vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                      ((dimensions<1UL,_1UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_dd,1);
    if (vVar2 + vVar3 <= uVar1) break;
    true_idx_2._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_2._4_4_;
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>
                        ((dimensions<0UL,_0UL> *)((long)&true_idx_2 + 3),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_f1,1);
      local_f0 = (vVar2 + vVar3) * (long)true_idx_2._4_4_ + (long)i_2;
      local_100 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x57,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_100,
                 &local_f0);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_b,true_idx_2._4_4_,i_2);
      local_108 = &i + sVar4;
      local_110 = &i + local_f0;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x59,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_108,
                 &local_110);
      vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                        ((dimensions<1UL,_1UL> *)local_b,0);
      bVar5 = false;
      if (vVar2 <= (ulong)(long)true_idx_2._4_4_) {
        uVar1 = (ulong)true_idx_2._4_4_;
        vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                          ((dimensions<1UL,_1UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_111,0);
        bVar5 = uVar1 < vVar2 + vVar3;
      }
      if (bVar5) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_b,true_idx_2._4_4_,i_2);
        local_118 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x5e,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&i + sVar4,
                   &local_118);
      }
      else {
        vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                          ((dimensions<1UL,_1UL> *)local_b,1);
        bVar5 = false;
        if (vVar2 <= (ulong)(long)i_2) {
          uVar1 = (ulong)i_2;
          vVar2 = std::experimental::dimensions<1UL,_1UL>::operator[]<int>
                            ((dimensions<1UL,_1UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<0UL,_0UL>::operator[]<int>(&local_119,1);
          bVar5 = uVar1 < vVar2 + vVar3;
        }
        if (bVar5) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
          local_124[1] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,100,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&i + sVar4,
                     local_124 + 1);
        }
        else {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
          local_124[0] = 0x2a;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","42",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x6a,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&i + sVar4,
                     local_124);
        }
      }
      true_idx_2._4_4_ = true_idx_2._4_4_ + 1;
    }
    i_2 = i_2 + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}